

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CInstIterNext(CInstIter *pIter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  int io;
  int ic;
  int ip;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter->iStart = -1;
  pIter->iEnd = -1;
  iVar2 = 0;
  do {
    if (iVar2 != 0) break;
    if (pIter->nInst <= pIter->iInst) {
      iVar2 = 0;
      break;
    }
    local_3c = -0x55555556;
    local_40 = -0x55555556;
    local_44 = -0x55555556;
    iVar2 = (*pIter->pApi->xInst)(pIter->pFts,pIter->iInst,&local_3c,&local_40,&local_44);
    iVar4 = local_44;
    iVar3 = 0;
    if (iVar2 == 0) {
      if (local_40 == pIter->iCol) {
        iVar3 = (*pIter->pApi->xPhraseSize)(pIter->pFts,local_3c);
        iVar4 = iVar4 + iVar3 + -1;
        if (pIter->iStart < 0) {
          pIter->iStart = local_44;
LAB_001f3afe:
          pIter->iEnd = iVar4;
          iVar3 = 0;
          bVar1 = true;
        }
        else {
          iVar3 = 0;
          if (pIter->iEnd < local_44) {
            iVar3 = 3;
            bVar1 = false;
          }
          else {
            bVar1 = true;
            if (pIter->iEnd < iVar4) goto LAB_001f3afe;
          }
        }
        if (!bVar1) goto LAB_001f3b16;
      }
      pIter->iInst = pIter->iInst + 1;
      iVar3 = 0;
    }
LAB_001f3b16:
  } while (iVar3 == 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts5CInstIterNext(CInstIter *pIter){
  int rc = SQLITE_OK;
  pIter->iStart = -1;
  pIter->iEnd = -1;

  while( rc==SQLITE_OK && pIter->iInst<pIter->nInst ){
    int ip; int ic; int io;
    rc = pIter->pApi->xInst(pIter->pFts, pIter->iInst, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      if( ic==pIter->iCol ){
        int iEnd = io - 1 + pIter->pApi->xPhraseSize(pIter->pFts, ip);
        if( pIter->iStart<0 ){
          pIter->iStart = io;
          pIter->iEnd = iEnd;
        }else if( io<=pIter->iEnd ){
          if( iEnd>pIter->iEnd ) pIter->iEnd = iEnd;
        }else{
          break;
        }
      }
      pIter->iInst++;
    }
  }

  return rc;
}